

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveproxy.cpp
# Opt level: O1

int __thiscall naiveproxy::daemonize(naiveproxy *this)

{
  __pid_t _Var1;
  int iVar2;
  int i;
  
  if (this->daemonized != false) {
    return 1;
  }
  _Var1 = fork();
  if (0 < _Var1) {
LAB_0010585e:
    exit(0);
  }
  if (-1 < _Var1) {
    setsid();
    _Var1 = fork();
    if (0 < _Var1) goto LAB_0010585e;
    if (-1 < _Var1) {
      open_only_once(this);
      iVar2 = chdir("/tmp");
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = 0;
      umask(0);
      do {
        close(iVar2);
        iVar2 = iVar2 + 1;
      } while (iVar2 == 1);
      signal(0x11,(__sighandler_t)0x1);
      this->daemonized = true;
      return 0;
    }
  }
  exit(1);
}

Assistant:

int naiveproxy::daemonize()
{
    if (daemonized == true)
        return 1;

    int pid;
    pid = fork();
    if (pid > 0)
        exit(0);
    else if (pid < 0)
        exit(1);

    //创建会话期
    setsid();

    //fork 两次
    pid = fork();
    if (pid > 0)
        exit(0);
    else if (pid < 0)
        exit(1);

    //保证程序只运行一次
    open_only_once();

    //设置工作目录，设置为/tmp保证具有权限
    int ret = chdir("/tmp");
    if (ret != 0)
    {
        return -1;
    }

    //设置权限掩码
    umask(0);

    //关闭已经打开的文件描述符
    //for (int i = 0; i < getdtablesize(); i++)
    for (int i = 0; i < 2; i++)
        close(i);

    //忽略SIGCHLD信号，防止产生僵尸进程
    signal(SIGCHLD, SIG_IGN);

    daemonized = true;
    return 0;
}